

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O1

int fits_hdecompress(uchar *input,int smooth,int *a,int *ny,int *nx,int *scale,int *status)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  sbyte sVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  uint n;
  uint uVar36;
  int iVar37;
  bool bVar38;
  double dVar39;
  uchar b [4];
  uint local_138;
  uint local_11c;
  ulong local_100;
  undefined8 local_e8;
  int local_e0;
  uint local_dc;
  ulong local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  uint local_bc;
  ulong local_b8;
  int *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  uint local_88;
  int local_84;
  int local_80;
  char local_7a [2];
  int *local_78;
  long local_70;
  int *local_68;
  int *local_60;
  long local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  iVar17 = *status;
  if (iVar17 < 1) {
    local_7a = *(char (*) [2])input;
    nextchar = 2;
    if (local_7a == code_magic) {
      uVar12 = *(uint *)(input + 2) & 0xff;
      lVar20 = 1;
      do {
        uVar12 = (uint)*(byte *)((long)&local_e8 + lVar20) | uVar12 << 8;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      *nx = uVar12;
      uVar12 = *(uint *)(input + 6) & 0xff;
      lVar20 = 1;
      do {
        uVar12 = (uint)*(byte *)((long)&local_e8 + lVar20) | uVar12 << 8;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      *ny = uVar12;
      uVar12 = *(uint *)(input + 10) & 0xff;
      lVar20 = 1;
      do {
        uVar12 = (uint)*(byte *)((long)&local_e8 + lVar20) | uVar12 << 8;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      *scale = uVar12;
      local_e8 = *(ulong *)(input + 0xe);
      uVar34 = local_e8 & 0xff;
      lVar20 = 1;
      do {
        uVar34 = (ulong)*(byte *)((long)&local_e8 + lVar20) | uVar34 << 8;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 8);
      bVar8 = input[0x16];
      bVar1 = input[0x17];
      bVar2 = input[0x18];
      nextchar = 0x19;
      iVar5 = *nx;
      iVar9 = *ny;
      uVar12 = iVar9 * iVar5;
      iVar27 = (iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1;
      iVar32 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
      if (0 < (int)uVar12) {
        memset(a,0,(ulong)uVar12 << 2);
      }
      bits_to_go = 0;
      iVar17 = qtree_decode(input,a,iVar9,iVar27,iVar32,(uint)bVar8);
      if (iVar17 == 0) {
        iVar17 = qtree_decode(input,a + iVar32,iVar9,iVar27,iVar9 / 2,(uint)bVar1);
        if (iVar17 == 0) {
          iVar17 = qtree_decode(input,a + iVar27 * iVar9,iVar9,iVar5 / 2,iVar32,(uint)bVar1);
          if ((iVar17 == 0) &&
             (iVar17 = qtree_decode(input,a + (iVar27 * iVar9 + iVar32),iVar9,iVar5 / 2,iVar9 / 2,
                                    (uint)bVar2), iVar17 == 0)) {
            iVar17 = input_nybble(input);
            if (iVar17 == 0) {
              bits_to_go = 0;
              if ((int)uVar12 < 1) {
                iVar17 = 0;
              }
              else {
                uVar23 = 0;
                uVar30 = 0;
                lVar20 = nextchar;
                uVar13 = buffer2;
                do {
                  if (a[uVar23] != 0) {
                    if (uVar30 == 0) {
                      uVar13 = (uint)input[lVar20];
                      lVar20 = lVar20 + 1;
                      uVar30 = 8;
                      nextchar = lVar20;
                      buffer2 = uVar13;
                    }
                    uVar30 = uVar30 - 1;
                    bits_to_go = uVar30;
                    if ((uVar13 >> (uVar30 & 0x1f) & 1) != 0) {
                      a[uVar23] = -a[uVar23];
                    }
                  }
                  uVar23 = uVar23 + 1;
                  iVar17 = 0;
                } while (uVar12 != uVar23);
              }
            }
            else {
              ffpmsg("dodecode: bad bit plane values");
              iVar17 = 0x19e;
            }
          }
        }
      }
      *a = (int)uVar34;
    }
    else {
      ffpmsg("bad file format");
      iVar17 = 0x19e;
    }
    *status = iVar17;
    if (iVar17 == 0) {
      iVar17 = *scale;
      if ((1 < iVar17) &&
         (iVar5 = *ny, iVar9 = *nx, piVar14 = a, a <= a + (long)iVar9 * (long)iVar5 + -1)) {
        do {
          *piVar14 = *piVar14 * iVar17;
          piVar14 = piVar14 + 1;
        } while (piVar14 <= a + (long)iVar9 * (long)iVar5 + -1);
      }
      uVar12 = *nx;
      uVar13 = *ny;
      uVar34 = (ulong)uVar13;
      iVar17 = *scale;
      uVar30 = uVar13;
      if ((int)uVar13 < (int)uVar12) {
        uVar30 = uVar12;
      }
      dVar39 = log((double)(int)uVar30);
      local_78 = (int *)malloc((long)((int)((uVar30 - ((int)(uVar30 + 1) >> 0x1f)) + 1) >> 1) << 2);
      if (local_78 == (int *)0x0) {
        ffpmsg("hinv: insufficient memory");
        iVar17 = 0x19e;
      }
      else {
        iVar9 = (int)(dVar39 / 0.6931471805599453 + 0.5);
        sVar21 = 1;
        bVar4 = 1 << ((byte)iVar9 & 0x1f) < (int)uVar30;
        iVar5 = (uint)bVar4 + iVar9;
        local_e0 = iVar9 + (uint)bVar4 + -1;
        bVar8 = (byte)local_e0;
        uVar30 = 1 << (bVar8 & 0x1f);
        *a = (*a >> 0x1f) + *a + ((4 << (bVar8 & 0x1f)) >> 1) & uVar30 * -4;
        if (0 < iVar5) {
          local_cc = 1 << ((byte)iVar5 & 0x1f);
          uVar24 = 2 << (bVar8 & 0x1f);
          uVar26 = (int)uVar24 >> 1;
          local_bc = iVar17 >> 1;
          bVar4 = 0 < (int)local_bc;
          local_d8 = (ulong)(uVar13 * 2);
          local_dc = -local_bc;
          local_9c = uVar13 * 3;
          lVar20 = (long)(int)(uVar13 * 2);
          local_a0 = uVar13 * 3 + 2;
          local_70 = (long)(int)uVar13 << 2;
          local_68 = a + lVar20;
          local_58 = lVar20 * -4;
          local_60 = a + (2 - lVar20);
          local_a4 = uVar13 * 2 + 2;
          local_b0 = a + 1;
          uVar23 = 1;
          local_100 = 1;
          local_11c = uVar30;
          local_b8 = uVar34;
          local_138 = uVar26 - 1;
          uVar22 = -uVar30;
          uVar13 = uVar30 * -2;
          do {
            uVar10 = uVar22;
            lVar20 = local_70;
            piVar14 = local_78;
            local_90 = local_e0;
            uVar30 = (int)uVar30 >> 1;
            local_cc = local_cc >> 1;
            local_94 = local_cc;
            if ((int)uVar12 <= local_cc) {
              local_94 = 0;
            }
            uVar22 = (int)uVar23 * 2 - (uint)((int)uVar12 <= local_cc);
            uVar23 = (ulong)uVar22;
            local_8c = (int)uVar34;
            local_98 = local_cc;
            if (local_8c <= local_cc) {
              local_98 = 0;
            }
            n = (int)local_100 * 2 - (uint)(local_8c <= local_cc);
            local_100 = (ulong)n;
            bVar38 = local_e0 == 0;
            local_e0 = local_e0 + -1;
            if (bVar38) {
              sVar21 = 2;
            }
            uVar6 = uVar30 - 1;
            if (bVar38) {
              uVar6 = 0;
            }
            piVar15 = a;
            uVar34 = uVar23;
            local_88 = uVar12;
            if (0 < (int)uVar22) {
              do {
                unshuffle(piVar15,n,1,piVar14);
                uVar34 = uVar34 - 1;
                piVar15 = (int *)((long)piVar15 + lVar20);
              } while (uVar34 != 0);
            }
            uVar34 = local_b8;
            piVar15 = a;
            uVar35 = local_100;
            if (0 < (int)n) {
              do {
                unshuffle(piVar15,uVar22,(int)uVar34,piVar14);
                uVar35 = uVar35 - 1;
                piVar15 = piVar15 + 1;
              } while (uVar35 != 0);
            }
            if (bVar4 && smooth != 0) {
              local_c0 = uVar22 - 2;
              if (4 < (int)uVar22) {
                iVar5 = 2;
                uVar34 = local_d8 & 0xffffffff;
                iVar17 = local_9c;
                do {
                  if (0 < (int)n) {
                    lVar20 = (long)(int)uVar34;
                    lVar25 = 0;
                    do {
                      iVar9 = *(int *)((long)a + lVar25 * 4 + local_58 + lVar20 * 4);
                      uVar31 = local_68[lVar20 + lVar25] - a[lVar20 + lVar25];
                      uVar36 = a[lVar20 + lVar25] - iVar9;
                      uVar12 = uVar36;
                      if ((int)uVar31 < (int)uVar36) {
                        uVar12 = uVar31;
                      }
                      if ((int)uVar36 < (int)uVar31) {
                        uVar36 = uVar31;
                      }
                      if ((int)uVar12 < 1) {
                        uVar12 = 0;
                      }
                      iVar27 = uVar12 * 4;
                      iVar32 = ((int)uVar36 >> 0x1f & uVar36) * 4;
                      if (SBORROW4(iVar32,iVar27) != (int)(iVar32 + uVar12 * -4) < 0) {
                        iVar9 = local_68[lVar20 + lVar25] - iVar9;
                        if (SBORROW4(iVar9,iVar27) != (int)(iVar9 + uVar12 * -4) < 0) {
                          iVar27 = iVar9;
                        }
                        if (iVar9 <= iVar32) {
                          iVar27 = iVar32;
                        }
                        uVar36 = iVar27 + a[iVar17 + lVar25] * -8;
                        uVar12 = (int)(uVar36 + 7) >> 3;
                        if (-1 < (int)uVar36) {
                          uVar12 = uVar36 >> 3;
                        }
                        if ((int)local_bc <= (int)uVar12) {
                          uVar12 = local_bc;
                        }
                        if ((int)uVar12 <= (int)local_dc) {
                          uVar12 = local_dc;
                        }
                        a[iVar17 + lVar25] = uVar12 + a[iVar17 + lVar25];
                      }
                      lVar25 = lVar25 + 2;
                    } while ((int)lVar25 < (int)n);
                  }
                  iVar5 = iVar5 + 2;
                  iVar17 = iVar17 + (int)local_d8;
                  uVar34 = (ulong)(uint)((int)uVar34 + (int)local_d8);
                } while (iVar5 < local_c0);
              }
              if (0 < (int)uVar22) {
                iVar17 = 0;
                iVar5 = 2;
                do {
                  if (4 < (int)n) {
                    lVar20 = 2;
                    do {
                      uVar31 = a[iVar5 + lVar20] - a[(long)iVar5 + lVar20 + -2];
                      uVar36 = a[(long)iVar5 + lVar20 + -2] - a[(long)iVar5 + lVar20 + -4];
                      uVar12 = uVar36;
                      if ((int)uVar31 < (int)uVar36) {
                        uVar12 = uVar31;
                      }
                      if ((int)uVar36 < (int)uVar31) {
                        uVar36 = uVar31;
                      }
                      if ((int)uVar12 < 1) {
                        uVar12 = 0;
                      }
                      iVar9 = uVar12 * 4;
                      iVar27 = ((int)uVar36 >> 0x1f & uVar36) * 4;
                      if (SBORROW4(iVar27,iVar9) != (int)(iVar27 + uVar12 * -4) < 0) {
                        iVar32 = a[iVar5 + lVar20] - a[(long)iVar5 + lVar20 + -4];
                        if (SBORROW4(iVar32,iVar9) != (int)(iVar32 + uVar12 * -4) < 0) {
                          iVar9 = iVar32;
                        }
                        if (iVar32 <= iVar27) {
                          iVar9 = iVar27;
                        }
                        uVar36 = iVar9 + a[(long)iVar5 + lVar20 + -1] * -8;
                        uVar12 = (int)(uVar36 + 7) >> 3;
                        if (-1 < (int)uVar36) {
                          uVar12 = uVar36 >> 3;
                        }
                        if ((int)local_bc <= (int)uVar12) {
                          uVar12 = local_bc;
                        }
                        if ((int)uVar12 <= (int)local_dc) {
                          uVar12 = local_dc;
                        }
                        a[(long)iVar5 + lVar20 + -1] = uVar12 + a[(long)iVar5 + lVar20 + -1];
                      }
                      lVar20 = lVar20 + 2;
                    } while ((int)lVar20 < (int)(n - 2));
                  }
                  iVar17 = iVar17 + 2;
                  iVar5 = iVar5 + (int)local_d8;
                } while (iVar17 < (int)uVar22);
              }
              if (4 < (int)uVar22) {
                local_80 = n - 2;
                local_c4 = local_a4;
                local_c8 = local_a0;
                iVar17 = 2;
                do {
                  local_84 = iVar17;
                  if (4 < (int)n) {
                    lVar20 = (long)local_c4;
                    local_38 = a + lVar20;
                    local_40 = local_68 + lVar20 + 2;
                    local_48 = local_60 + lVar20;
                    local_50 = local_b0 + local_c8;
                    lVar20 = 0;
                    do {
                      iVar17 = local_50[lVar20 + -1];
                      iVar5 = local_38[lVar20];
                      iVar32 = local_40[lVar20] - iVar5;
                      iVar27 = iVar5 - local_40[lVar20 + -4];
                      iVar9 = local_48[lVar20 + -4] - iVar5;
                      iVar5 = iVar5 - local_48[lVar20];
                      iVar16 = 0;
                      if (0 < iVar9) {
                        iVar16 = iVar9;
                      }
                      if (-1 < iVar9) {
                        iVar9 = 0;
                      }
                      iVar28 = 0;
                      if (0 < iVar5) {
                        iVar28 = iVar5;
                      }
                      if (-1 < iVar5) {
                        iVar5 = 0;
                      }
                      iVar33 = 0;
                      if (0 < iVar27) {
                        iVar33 = iVar27;
                      }
                      if (-1 < iVar27) {
                        iVar27 = 0;
                      }
                      iVar37 = 0;
                      if (0 < iVar32) {
                        iVar37 = iVar32;
                      }
                      iVar3 = local_38[lVar20 + 1];
                      if (-1 < iVar32) {
                        iVar32 = 0;
                      }
                      iVar11 = iVar17 * 2 + iVar3 * 2;
                      iVar37 = iVar37 - iVar11;
                      iVar33 = iVar33 + iVar17 * 2 + iVar3 * -2;
                      if (iVar37 < iVar33) {
                        iVar33 = iVar37;
                      }
                      iVar16 = iVar16 + iVar17 * 2;
                      iVar28 = iVar28 + iVar17 * -2;
                      if (iVar16 <= iVar28) {
                        iVar28 = iVar16;
                      }
                      iVar28 = iVar28 + iVar3 * 2;
                      if (iVar28 <= iVar33) {
                        iVar33 = iVar28;
                      }
                      iVar32 = iVar32 - iVar11;
                      iVar27 = iVar27 + iVar17 * 2 + iVar3 * -2;
                      iVar16 = iVar33 * 0x10;
                      if (iVar27 < iVar32) {
                        iVar27 = iVar32;
                      }
                      iVar5 = iVar5 + iVar17 * -2;
                      iVar9 = iVar9 + iVar17 * 2;
                      if (iVar5 <= iVar9) {
                        iVar5 = iVar9;
                      }
                      iVar5 = iVar5 + iVar3 * 2;
                      if (iVar27 <= iVar5) {
                        iVar27 = iVar5;
                      }
                      iVar17 = iVar27 * 0x10;
                      if (SBORROW4(iVar17,iVar16) != iVar17 + iVar33 * -0x10 < 0) {
                        iVar5 = (local_48[lVar20 + -4] - (local_40[lVar20 + -4] + local_48[lVar20]))
                                + local_40[lVar20];
                        if (SBORROW4(iVar5,iVar16) != iVar5 + iVar33 * -0x10 < 0) {
                          iVar16 = iVar5;
                        }
                        if (iVar5 == iVar17 || SBORROW4(iVar5,iVar17) != iVar5 + iVar27 * -0x10 < 0)
                        {
                          iVar16 = iVar17;
                        }
                        uVar36 = iVar16 + local_50[lVar20] * -0x40;
                        uVar12 = (int)(uVar36 + 0x3f) >> 6;
                        if (-1 < (int)uVar36) {
                          uVar12 = uVar36 >> 6;
                        }
                        if ((int)local_bc <= (int)uVar12) {
                          uVar12 = local_bc;
                        }
                        if ((int)uVar12 <= (int)local_dc) {
                          uVar12 = local_dc;
                        }
                        local_50[lVar20] = uVar12 + local_50[lVar20];
                      }
                      iVar17 = (int)lVar20;
                      lVar20 = lVar20 + 2;
                    } while (iVar17 + 4 < local_80);
                  }
                  local_c8 = local_c8 + (int)local_d8;
                  local_c4 = local_c4 + (int)local_d8;
                  iVar17 = local_84 + 2;
                } while (local_84 + 2 < local_c0);
              }
            }
            uVar12 = uVar22 - ((int)uVar22 >> 0x1f) & 0xfffffffe;
            iVar5 = (int)n % 2;
            iVar17 = (int)local_b8;
            if ((int)uVar12 < 1) {
              iVar9 = 0;
            }
            else {
              lVar20 = 0;
              iVar9 = 0;
              uVar34 = local_b8;
              do {
                if ((int)(n - iVar5) < 1) {
                  iVar32 = iVar9 * iVar17;
                  iVar27 = iVar32 + iVar17;
                }
                else {
                  iVar27 = (int)uVar34;
                  iVar16 = (int)lVar20;
                  lVar25 = 0;
                  do {
                    uVar36 = uVar26;
                    if (local_b0[(long)iVar27 + lVar25 + -1] < 0) {
                      uVar36 = local_138;
                    }
                    uVar31 = uVar36 + local_b0[(long)iVar27 + lVar25 + -1] & uVar13;
                    uVar36 = uVar26;
                    if (local_b0[iVar16 + lVar25] < 0) {
                      uVar36 = local_138;
                    }
                    uVar18 = uVar36 + local_b0[iVar16 + lVar25] & uVar13;
                    uVar36 = uVar30;
                    if (local_b0[iVar27 + lVar25] < 0) {
                      uVar36 = uVar6;
                    }
                    uVar7 = uVar36 + local_b0[iVar27 + lVar25] & uVar10;
                    uVar29 = uVar7 & local_11c;
                    uVar36 = -uVar29;
                    if ((int)uVar31 < 0) {
                      uVar36 = uVar29;
                    }
                    uVar36 = uVar36 + uVar31;
                    iVar32 = local_b0[(long)iVar16 + lVar25 + -1];
                    uVar31 = -uVar29;
                    if ((int)uVar18 < 0) {
                      uVar31 = uVar29;
                    }
                    uVar31 = uVar31 + uVar18;
                    uVar18 = (uVar36 ^ uVar7 ^ uVar31) & uVar24;
                    if (iVar32 < 0) {
                      uVar19 = uVar29 - uVar18;
                      if (uVar29 == 0) {
                        uVar19 = uVar18;
                      }
                      iVar32 = uVar19 + iVar32;
                    }
                    else {
                      iVar32 = (uVar29 + iVar32) - uVar18;
                    }
                    local_b0[iVar27 + lVar25] = (int)(iVar32 + uVar36 + uVar31 + uVar7) >> sVar21;
                    local_b0[(long)iVar27 + lVar25 + -1] =
                         (int)((iVar32 + uVar36) - (uVar31 + uVar7)) >> sVar21;
                    local_b0[iVar16 + lVar25] =
                         (int)((uVar31 - uVar7) + (iVar32 - uVar36)) >> sVar21;
                    local_b0[(long)iVar16 + lVar25 + -1] =
                         (int)((uVar7 - uVar31) + (iVar32 - uVar36)) >> sVar21;
                    lVar25 = lVar25 + 2;
                    iVar32 = (int)lVar25;
                  } while (iVar32 < (int)(n - iVar5));
                  iVar27 = iVar27 + iVar32;
                  iVar32 = iVar32 + iVar16;
                }
                if (iVar5 != 0) {
                  uVar36 = uVar26;
                  if (a[iVar27] < 0) {
                    uVar36 = local_138;
                  }
                  uVar31 = uVar36 + a[iVar27] & uVar13;
                  uVar36 = -(uVar31 & uVar24);
                  if (a[iVar32] < 0) {
                    uVar36 = uVar31 & uVar24;
                  }
                  iVar16 = uVar36 + a[iVar32];
                  a[iVar27] = (int)(iVar16 + uVar31) >> sVar21;
                  a[iVar32] = (int)(iVar16 - uVar31) >> sVar21;
                }
                iVar9 = iVar9 + 2;
                lVar20 = lVar20 + local_d8;
                uVar34 = uVar34 + local_d8;
              } while (iVar9 < (int)uVar12);
            }
            if (uVar22 != uVar12) {
              iVar9 = iVar9 * iVar17;
              if (iVar5 < (int)n) {
                lVar20 = 0;
                do {
                  uVar12 = uVar26;
                  if (local_b0[iVar9 + lVar20] < 0) {
                    uVar12 = local_138;
                  }
                  uVar22 = uVar12 + local_b0[iVar9 + lVar20] & uVar13;
                  uVar12 = -(uVar22 & uVar24);
                  if (local_b0[(long)iVar9 + lVar20 + -1] < 0) {
                    uVar12 = uVar22 & uVar24;
                  }
                  iVar17 = uVar12 + local_b0[(long)iVar9 + lVar20 + -1];
                  local_b0[iVar9 + lVar20] = (int)(iVar17 + uVar22) >> sVar21;
                  local_b0[(long)iVar9 + lVar20 + -1] = (int)(iVar17 - uVar22) >> sVar21;
                  lVar20 = lVar20 + 2;
                } while ((int)lVar20 < (int)(n - iVar5));
                iVar9 = iVar9 + (int)lVar20;
              }
              if (iVar5 != 0) {
                a[iVar9] = a[iVar9] >> sVar21;
              }
            }
            uVar12 = local_88 - local_94;
            uVar34 = (ulong)(uint)(local_8c - local_98);
            uVar24 = local_11c;
            local_11c = (int)local_11c >> 1;
            local_138 = uVar6;
            uVar22 = (int)uVar10 >> 1;
            uVar13 = uVar10;
            uVar26 = uVar30;
          } while (0 < local_90);
        }
        free(local_78);
        iVar17 = 0;
      }
      *status = iVar17;
    }
  }
  return iVar17;
}

Assistant:

int fits_hdecompress(unsigned char *input, int smooth, int *a, int *ny, int *nx, 
                     int *scale, int *status)
{
  /* 
     decompress the input byte stream using the H-compress algorithm
  
   input  - input array of compressed bytes
   a - pre-allocated array to hold the output uncompressed image
   nx - returned X axis size
   ny - returned Y axis size

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */
int stat;

  if (*status > 0) return(*status);

	/* decode the input array */

        FFLOCK;  /* decode uses the nextchar global variable */
	stat = decode(input, a, nx, ny, scale);
        FFUNLOCK;

        *status = stat;
	if (stat) return(*status);
	
	/*
	 * Un-Digitize
	 */
	undigitize(a, *nx, *ny, *scale);

	/*
	 * Inverse H-transform
	 */
	stat = hinv(a, *nx, *ny, smooth, *scale);
        *status = stat;
	
  return(*status);
}